

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall cmComputeLinkDepends::~cmComputeLinkDepends(cmComputeLinkDepends *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->ObjectEntries).super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree(&(this->OldWrongConfigItems)._M_t);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>);
  std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  ~unique_ptr(&this->CCG);
  std::
  _Rb_tree<int,_std::pair<const_int,_cmComputeLinkDepends::PendingComponent>,_std::_Select1st<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>_>
  ::~_Rb_tree(&(this->PendingComponents)._M_t);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->ComponentOrder).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->ComponentVisited).super__Vector_base<char,_std::allocator<char>_>);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::~vector
            (&(this->EntryConstraintGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  std::
  vector<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
  ::~vector(&this->InferredDependSets);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->SharedDepFollowed)._M_t);
  std::
  deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
  ::~deque(&(this->SharedDepQueue).c);
  std::_Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
  ::~_Deque_base((_Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                  *)&this->BFSQueue);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&(this->GroupItems)._M_t);
  std::
  _Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_int>,_std::_Select1st<std::pair<const_cmLinkItem,_int>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_int>_>_>
  ::~_Rb_tree(&(this->LinkEntryIndex)._M_t);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  ~vector(&this->EntryList);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->LinkLibraryOverride)._M_t);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  ~vector(&this->FinalLinkEntries);
  std::__cxx11::string::~string((string *)&this->Config);
  std::__cxx11::string::~string((string *)&this->LinkLanguage);
  return;
}

Assistant:

cmComputeLinkDepends::~cmComputeLinkDepends() = default;